

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O1

void __thiscall
OutputBox::StartUnitaryBox(OutputBox *this,string *dataset_name,size_t n_things_todo)

{
  pointer pcVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  string complete_pre_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_110;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [32];
  size_t local_90;
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  size_t local_48;
  size_t sStack_40;
  uint local_38;
  
  pcVar1 = local_b0 + 0x10;
  pcVar4 = (dataset_name->_M_dataplus)._M_p;
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar4,pcVar4 + dataset_name->_M_string_length);
  std::__cxx11::string::append((char *)local_b0);
  PrintData(this,(string *)local_b0);
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  local_b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct((ulong)local_b0,(char)this->pre_spaces_);
  plVar6 = (long *)std::__cxx11::string::append(local_b0);
  plVar7 = plVar6 + 2;
  if ((long *)*plVar6 == plVar7) {
    local_100 = *plVar7;
    lStack_f8 = plVar6[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar7;
    local_110 = (long *)*plVar6;
  }
  lVar5 = plVar6[1];
  *plVar6 = (long)plVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((pointer)local_b0._0_8_ != pcVar1) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  uVar2 = this->pre_spaces_;
  uVar3 = this->bar_width_;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_110,lVar5 + (long)local_110);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0," |","");
  ProgressBar::ProgressBar
            ((ProgressBar *)local_b0,n_things_todo,1,(ulong)(uVar2 + uVar3),&local_d0,&local_f0);
  (this->pb).console_width_ = local_90;
  (this->pb).gap_ = local_b0._16_8_;
  (this->pb).bar_width_ = local_b0._24_8_;
  (this->pb).prev_ = local_b0._0_8_;
  (this->pb).n_things_todo_ = local_b0._8_8_;
  std::__cxx11::string::operator=((string *)&(this->pb).post_message_,(string *)&local_88);
  std::__cxx11::string::operator=((string *)&(this->pb).pre_message_,(string *)&local_68);
  (this->pb).cur_test_ = local_38;
  (this->pb).n_tests_ = local_48;
  (this->pb).n_tests_length_ = sStack_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  ProgressBar::Start(&this->pb);
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  return;
}

Assistant:

void StartUnitaryBox(const std::string &dataset_name, const size_t n_things_todo)
    {
        PrintData(dataset_name + ":");
        std::string complete_pre_message = std::string(pre_spaces_, ' ') + "|  ";
        pb = ProgressBar(n_things_todo, 1, bar_width_ + pre_spaces_, complete_pre_message, " |");
        pb.Start();
    }